

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O0

void __thiscall
cmDocumentationFormatter::PrintSection
          (cmDocumentationFormatter *this,ostream *os,cmDocumentationSection *section)

{
  cmDocumentationSection *pcVar1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *this_00;
  ulong uVar5;
  unsigned_long *puVar6;
  unsigned_long local_b0;
  int local_a8;
  int local_a4;
  reference local_a0;
  cmDocumentationEntry *entry;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *__range1;
  string local_70;
  size_t local_50;
  size_t savedIndent;
  size_t TITLE_SIZE;
  size_t PADDING_SIZE;
  size_t NAME_SIZE;
  size_t SUFFIX_SIZE;
  size_t PREFIX_SIZE;
  cmDocumentationSection *section_local;
  ostream *os_local;
  cmDocumentationFormatter *this_local;
  
  SUFFIX_SIZE = 2;
  NAME_SIZE = 2;
  PADDING_SIZE = 0x1d;
  TITLE_SIZE = 4;
  savedIndent = 0x21;
  local_50 = this->TextIndent;
  PREFIX_SIZE = (size_t)section;
  section_local = (cmDocumentationSection *)os;
  os_local = (ostream *)this;
  cmDocumentationSection::GetName_abi_cxx11_(&local_70,section);
  poVar4 = std::operator<<(os,(string *)&local_70);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)&local_70);
  this_00 = cmDocumentationSection::GetEntries((cmDocumentationSection *)PREFIX_SIZE);
  __end1 = std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::begin(this_00);
  entry = (cmDocumentationEntry *)
          std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
                                *)&entry);
    if (!bVar2) break;
    local_a0 = __gnu_cxx::
               __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
               ::operator*(&__end1);
    uVar5 = std::__cxx11::string::empty();
    pcVar1 = section_local;
    if ((uVar5 & 1) == 0) {
      this->TextIndent = 0x21;
      local_a4 = (int)std::setw(2);
      poVar4 = std::operator<<((ostream *)pcVar1,(_Setw)local_a4);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
      poVar4 = std::operator<<(poVar4,local_a0->CustomNamePrefix);
      local_b0 = std::__cxx11::string::size();
      puVar6 = std::max<unsigned_long>(&PADDING_SIZE,&local_b0);
      local_a8 = (int)std::setw((int)*puVar6);
      poVar4 = std::operator<<(poVar4,(_Setw)local_a8);
      std::operator<<(poVar4,(string *)local_a0);
      uVar5 = std::__cxx11::string::size();
      if (0x1d < uVar5) {
        poVar4 = std::operator<<((ostream *)section_local,'\n');
        _Var3 = std::setw((int)this->TextIndent + -2);
        poVar4 = std::operator<<(poVar4,_Var3);
        std::operator<<(poVar4,' ');
      }
      std::operator<<((ostream *)section_local,"= ");
      PrintColumn(this,(ostream *)section_local,&local_a0->Brief);
      std::operator<<((ostream *)section_local,'\n');
    }
    else {
      std::operator<<((ostream *)section_local,'\n');
      this->TextIndent = 0;
      PrintFormatted(this,(ostream *)section_local,&local_a0->Brief);
    }
    __gnu_cxx::
    __normal_iterator<const_cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)section_local,'\n');
  this->TextIndent = local_50;
  return;
}

Assistant:

void cmDocumentationFormatter::PrintSection(
  std::ostream& os, cmDocumentationSection const& section)
{
  const std::size_t PREFIX_SIZE =
    sizeof(cmDocumentationEntry::CustomNamePrefix) + 1u;
  // length of the "= " literal (see below)
  const std::size_t SUFFIX_SIZE = 2u;
  // legacy magic number ;-)
  const std::size_t NAME_SIZE = 29u;

  const std::size_t PADDING_SIZE = PREFIX_SIZE + SUFFIX_SIZE;
  const std::size_t TITLE_SIZE = NAME_SIZE + PADDING_SIZE;

  const auto savedIndent = this->TextIndent;

  os << section.GetName() << '\n';

  for (cmDocumentationEntry const& entry : section.GetEntries()) {
    if (!entry.Name.empty()) {
      this->TextIndent = TITLE_SIZE;
      os << std::setw(PREFIX_SIZE) << std::left << entry.CustomNamePrefix
         << std::setw(int(std::max(NAME_SIZE, entry.Name.size())))
         << entry.Name;
      if (entry.Name.size() > NAME_SIZE) {
        os << '\n' << std::setw(int(this->TextIndent - PREFIX_SIZE)) << ' ';
      }
      os << "= ";
      this->PrintColumn(os, entry.Brief);
      os << '\n';
    } else {
      os << '\n';
      this->TextIndent = 0u;
      this->PrintFormatted(os, entry.Brief);
    }
  }

  os << '\n';

  this->TextIndent = savedIndent;
}